

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O3

void handle_unexpected_msg(atom_server as,char *msg)

{
  uint uVar1;
  ClientData pvVar2;
  undefined8 *puVar3;
  int iVar4;
  long lVar5;
  Tcl_HashEntry *pTVar6;
  uint uVar7;
  char *__s2;
  uint uVar8;
  uint uVar9;
  char cVar10;
  char *__s1;
  char local_48;
  char local_40;
  char *local_38;
  
  if (*msg != 'E') {
    printf("Warning: Got an unexpected message \"%s\"\n");
    return;
  }
  lVar5 = strtol(msg + 1,&local_38,10);
  __s2 = local_38 + 1;
  pTVar6 = (*(as->string_hash_table).findProc)(&as->string_hash_table,__s2);
  cVar10 = (char)((ulong)lVar5 >> 0x18);
  iVar4 = (int)((ulong)lVar5 >> 0x18);
  local_40 = (char)((ulong)lVar5 >> 8);
  local_48 = (char)((ulong)lVar5 >> 0x10);
  uVar9 = (uint)((ulong)lVar5 >> 8);
  uVar7 = (uint)((ulong)lVar5 >> 0x10);
  if (((pTVar6 != (Tcl_HashEntry *)0x0) && (pvVar2 = pTVar6->clientData, pvVar2 != (ClientData)0x0))
     && (uVar8 = (uint)lVar5 & 0xff | (uVar9 & 0xff) << 8 | (uVar7 & 0xff) << 0x10 | iVar4 << 0x18,
        *(uint *)((long)pvVar2 + 8) != uVar8)) {
    puts("Warning:  Atom use inconsistency.");
    uVar1 = *(uint *)((long)pvVar2 + 8);
    printf("\tThis program associates the string \"%s\" with atom value %d, %x, \'%c%c%c%c\'\n",__s2
           ,(ulong)uVar1,(ulong)uVar1,(ulong)(uint)(int)(char)uVar1,
           (ulong)(uint)(int)(char)(uVar1 >> 8),(ulong)(uint)(int)(char)(uVar1 >> 0x10),
           (ulong)(uint)((int)uVar1 >> 0x18));
    printf("\tOther programs use the atom value %d, %x, \'%c%c%c%c\'\n",(ulong)uVar8,(ulong)uVar8,
           (ulong)(uint)(int)(char)lVar5,(ulong)(uint)(int)local_40,(ulong)(uint)(int)local_48,
           (ulong)(uint)(int)cVar10);
  }
  uVar9 = (uint)lVar5 & 0xff | (uVar9 & 0xff) << 8 | (uVar7 & 0xff) << 0x10 | iVar4 << 0x18;
  pTVar6 = (*(as->value_hash_table).findProc)(&as->value_hash_table,(char *)(long)(int)uVar9);
  if (pTVar6 != (Tcl_HashEntry *)0x0) {
    puVar3 = (undefined8 *)pTVar6->clientData;
    __s1 = (char *)*puVar3;
    iVar4 = strcmp(__s1,__s2);
    if (iVar4 != 0) {
      puts("Warning:  Atom use inconsistency.");
      uVar7 = *(uint *)(puVar3 + 1);
      printf("\tThis program associates the string \"%s\" with atom value %d, %x, \'%c%c%c%c\'\n",
             *puVar3,(ulong)uVar7,(ulong)uVar7,(ulong)(uint)(int)(char)uVar7,
             (ulong)(uint)(int)(char)(uVar7 >> 8),(ulong)(uint)(int)(char)(uVar7 >> 0x10),
             (ulong)(uint)((int)uVar7 >> 0x18));
      printf("\tOther programs associate the string \"%s\" with that value\n",__s2);
      __s1 = (char *)*puVar3;
    }
    printf("Atom cache inconsistency, tried to associate value %d %x, \'%c%c%c%c\' with string \"%s\"\n\tPrevious association was string \"%s\"\n"
           ,(ulong)uVar9,(ulong)uVar9,(ulong)(uint)(int)(char)lVar5,(ulong)(uint)(int)local_40,
           (ulong)(uint)(int)local_48,(ulong)(uint)(int)cVar10,__s2,__s1);
  }
  return;
}

Assistant:

static void
handle_unexpected_msg(atom_server as, char *msg)
{
    switch (msg[0]) {
    case 'E':{
	    Tcl_HashEntry *entry = NULL;
	    char *str;
	    int atom;
	    atom = strtol(&msg[1], &str, 10);
	    str++;
	    entry = Tcl_FindHashEntry(&as->string_hash_table, str);
	    if (entry != NULL) {
		send_get_atom_msg_ptr atom_entry =
		(send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
		if ((atom_entry != NULL) && (atom_entry->atom != atom)) {
		    printf("Warning:  Atom use inconsistency.\n");
		    printf("\tThis program associates the string \"%s\" with atom value %d, %x, '%c%c%c%c'\n",
			   str, atom_entry->atom, atom_entry->atom,
			   ((char*)&atom_entry->atom)[0],
			   ((char*)&atom_entry->atom)[1],
			   ((char*)&atom_entry->atom)[2],
			   ((char*)&atom_entry->atom)[3]);
		    printf("\tOther programs use the atom value %d, %x, '%c%c%c%c'\n", atom,
			   atom, ((char*)&atom)[0], ((char*)&atom)[1], 
			((char*)&atom)[2], ((char*)&atom)[3]
			);
		}
	    }
	    entry = Tcl_FindHashEntry(&as->value_hash_table, (char *) (int64_t)atom);
	    if (entry != NULL) {
		send_get_atom_msg_ptr atom_entry =
		(send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
		if ((atom_entry != NULL) &&
		    (strcmp(atom_entry->atom_string, str) != 0)) {
		    printf("Warning:  Atom use inconsistency.\n");
		    printf("\tThis program associates the string \"%s\" with atom value %d, %x, '%c%c%c%c'\n",
			   atom_entry->atom_string, atom_entry->atom,
			   atom_entry->atom, 
			   ((char*)&atom_entry->atom)[0],
			   ((char*)&atom_entry->atom)[1],
			   ((char*)&atom_entry->atom)[2],
			   ((char*)&atom_entry->atom)[3]);
		    printf("\tOther programs associate the string \"%s\" with that value\n", str);
		}
		printf("Atom cache inconsistency, tried to associate value %d %x, '%c%c%c%c' with string \"%s\"\n	Previous association was string \"%s\"\n",
		       atom, atom, ((char*)&atom)[0], ((char*)&atom)[1], 
		       ((char*)&atom)[2], ((char*)&atom)[3], str, atom_entry->atom_string);
	    }
	    break;
	}
    default:
	printf("Warning: Got an unexpected message \"%s\"\n", msg);
    }
}